

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMakeAssociationNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_90 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_54f70302 gcFrame;
  sysbvm_astMakeAssociationNode_t **associationNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x18);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_90 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_90);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_evaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  if (*(long *)(*arguments + 0x30) != 0) {
    gcFrame.key = sysbvm_interpreter_evaluateASTWithEnvironment
                            (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
  }
  sVar1 = sysbvm_association_create(context,(sysbvm_tuple_t)gcFrameRecord.roots,gcFrame.key);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_90);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeAssociationNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeAssociationNode_t **associationNode = (sysbvm_astMakeAssociationNode_t**)node;

    struct {
        sysbvm_tuple_t key;
        sysbvm_tuple_t value;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*associationNode)->super.sourcePosition);

    gcFrame.key = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*associationNode)->key, *environment);
    if((*associationNode)->value)
        gcFrame.value = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*associationNode)->value, *environment);
    gcFrame.result = sysbvm_association_create(context, gcFrame.key, gcFrame.value);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}